

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

void __thiscall
gutil::InvalidArgumentException::InvalidArgumentException
          (InvalidArgumentException *this,string *message)

{
  Exception *in_RSI;
  undefined8 *in_RDI;
  allocator local_31;
  string local_30 [16];
  string *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Invalid argument",&local_31);
  Exception::Exception(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *in_RDI = &PTR__InvalidArgumentException_001c3848;
  return;
}

Assistant:

InvalidArgumentException(const std::string &message) :
      Exception("Invalid argument", message) { }